

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 fts5IndexDataVersion(Fts5Index *p)

{
  int iVar1;
  int iVar2;
  Fts5Index *in_RDI;
  sqlite3_stmt *in_stack_00000008;
  i64 iVersion;
  undefined8 in_stack_ffffffffffffffd8;
  sqlite3_stmt *in_stack_ffffffffffffffe0;
  Fts5Index *p_00;
  sqlite3_stmt **local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_8 = (sqlite3_stmt **)0x0;
  if (in_RDI->rc == 0) {
    p_00 = in_RDI;
    if (in_RDI->pDataVersion == (sqlite3_stmt *)0x0) {
      in_stack_ffffffffffffffe0 = (sqlite3_stmt *)&in_RDI->pDataVersion;
      sqlite3_mprintf("PRAGMA %Q.data_version",in_RDI->pConfig->zDb);
      iVar2 = (int)((ulong)in_RDI >> 0x20);
      iVar1 = fts5IndexPrepareStmt(p_00,local_8,(char *)in_stack_ffffffffffffffe0);
      p_00->rc = iVar1;
      if (p_00->rc != 0) {
        return 0;
      }
    }
    iVar1 = sqlite3_step(in_stack_00000008);
    if (iVar1 == 100) {
      local_8 = (sqlite3_stmt **)sqlite3_column_int64(in_stack_ffffffffffffffe0,iVar2);
    }
    iVar2 = sqlite3_reset((sqlite3_stmt *)p_00);
    p_00->rc = iVar2;
  }
  return (i64)local_8;
}

Assistant:

static i64 fts5IndexDataVersion(Fts5Index *p){
  i64 iVersion = 0;

  if( p->rc==SQLITE_OK ){
    if( p->pDataVersion==0 ){
      p->rc = fts5IndexPrepareStmt(p, &p->pDataVersion,
          sqlite3_mprintf("PRAGMA %Q.data_version", p->pConfig->zDb)
          );
      if( p->rc ) return 0;
    }

    if( SQLITE_ROW==sqlite3_step(p->pDataVersion) ){
      iVersion = sqlite3_column_int64(p->pDataVersion, 0);
    }
    p->rc = sqlite3_reset(p->pDataVersion);
  }

  return iVersion;
}